

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

BrushData parseBrushValue(Value *v,QPalette *pal)

{
  QVariant *this;
  _Head_base<0UL,_QBrushData_*,_false> _Var1;
  DataPtr DVar2;
  bool bVar3;
  ColorRole CVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CoordinateMode CVar9;
  QBrush *pQVar10;
  Node<QString,_double> *pNVar11;
  int iVar12;
  QPalette *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Symbol *pSVar13;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  CoordinateMode CVar14;
  long lVar15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  undefined8 *puVar19;
  long in_FS_OFFSET;
  byte bVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double fy;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  BrushData BVar45;
  QLinearGradient lg;
  qreal local_2b0;
  qreal local_298;
  QLatin1String local_278;
  undefined1 local_268 [32];
  undefined1 *local_248;
  QArrayData *pQStack_240;
  char16_t *local_238;
  undefined1 *puStack_230;
  QString local_228;
  QArrayDataPointer<QString> local_208;
  QHash<QString,_double> local_1f0;
  QArrayDataPointer<QString> local_1e8;
  QGradientStops local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<QString> local_188;
  pair<double,_QColor> local_168;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined1 local_108 [32];
  QGradientData local_e8;
  Value local_b0;
  undefined1 local_88 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_80;
  undefined8 local_68;
  Value local_60;
  __uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter> local_38;
  
  bVar20 = 0;
  local_38._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(tuple<QBrushData_*,_QBrushDataPointerDeleter> *)(in_FS_OFFSET + 0x28);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60.type = *(Type *)&pal->d;
  QVariant::QVariant(&local_60.variant,(QVariant *)&pal->currentGroup);
  parseColorValue((ColorData *)local_128,&local_60);
  QVariant::~QVariant(&local_60.variant);
  if (local_118._4_4_ == Role) {
    CVar4 = (ColorRole)local_118;
    QBrush::QBrush((QBrush *)v);
    *(ColorRole *)&(v->variant).d.data = CVar4;
    *(undefined4 *)((long)&(v->variant).d.data + 4) = 2;
    uVar22 = extraout_RDX_00;
  }
  else if (local_118._4_4_ == Color) {
    QBrush::QBrush((QBrush *)local_108,(QColor *)local_128,SolidPattern);
    QBrush::QBrush((QBrush *)v,(QBrush *)local_108);
    (v->variant).d.data.shared = (PrivateShared *)0x100000011;
    QBrush::~QBrush((QBrush *)local_108);
    uVar22 = extraout_RDX;
  }
  else if (*(int *)&pal->d == 9) {
    local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QVariant::toStringList();
    if ((undefined1 *)local_188.size == (undefined1 *)0x2) {
      local_1a8.d = (Data *)0x0;
      local_1a8.ptr = (QString *)0x0;
      local_1a8.size = 0;
      QVar28.m_data = (storage_type *)0xf;
      QVar28.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar28);
      local_268._0_8_ = local_108._0_8_;
      local_268._8_8_ = local_108._8_8_;
      local_268._16_8_ = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_268);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar29.m_data = (storage_type *)0xf;
      QVar29.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar29);
      local_88 = (undefined1  [8])local_108._0_8_;
      aStack_80.shared = (PrivateShared *)local_108._8_8_;
      aStack_80._8_8_ = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_88);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar30.m_data = &DAT_00000010;
      QVar30.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar30);
      local_1c8.d.d = (Data *)local_108._0_8_;
      local_1c8.d.ptr = (pair<double,_QColor> *)local_108._8_8_;
      local_1c8.d.size = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)&local_1c8);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar31.m_data = (storage_type *)0x9;
      QVar31.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar31);
      local_1e8.d = (Data *)local_108._0_8_;
      local_1e8.ptr = (QString *)local_108._8_8_;
      local_1e8.size = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)&local_1e8);
      QList<QString>::end((QList<QString> *)&local_1a8);
      if ((QBrushData *)local_1e8.d != (QBrushData *)0x0) {
        LOCK();
        ((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1e8.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QBrushData *)local_1c8.d.d != (QBrushData *)0x0) {
        LOCK();
        ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
        }
      }
      QString::toLower_helper((QString *)local_108);
      QVar42.m_data = (storage_type_conflict *)local_108._8_8_;
      QVar42.m_size = local_108._16_8_;
      iVar6 = QtPrivate::QStringList_indexOf((QList_conflict *)&local_1a8,QVar42,0,CaseSensitive);
      if ((QBrushData *)local_108._0_8_ != (QBrushData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      if (iVar6 != -1) {
        local_1f0.d = (Data<QHashPrivate::Node<QString,_double>_> *)0x0;
        local_1c8.d.size = 0;
        local_1c8.d.d = (Data *)0x0;
        local_1c8.d.ptr = (pair<double,_QColor> *)0x0;
        local_1e8.size = 0;
        local_1e8.d = (Data *)0x0;
        local_1e8.ptr = (QString *)0x0;
        QVar32.m_data = (storage_type *)0x3;
        QVar32.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar32);
        local_268._0_8_ = local_108._0_8_;
        local_268._8_8_ = local_108._8_8_;
        local_268._16_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)local_268);
        QList<QString>::end((QList<QString> *)&local_1e8);
        QVar33.m_data = (storage_type *)0x7;
        QVar33.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar33);
        local_88 = (undefined1  [8])local_108._0_8_;
        aStack_80.shared = (PrivateShared *)local_108._8_8_;
        aStack_80._8_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)local_88);
        QList<QString>::end((QList<QString> *)&local_1e8);
        QVar34.m_data = &DAT_00000006;
        QVar34.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar34);
        local_208.d = (Data *)local_108._0_8_;
        local_208.ptr = (QString *)local_108._8_8_;
        local_208.size = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)&local_208);
        QList<QString>::end((QList<QString> *)&local_1e8);
        if ((QBrushData *)local_208.d != (QBrushData *)0x0) {
          LOCK();
          ((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_208.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
          }
        }
        local_208.d = (Data *)0x0;
        local_208.ptr = (QString *)0x0;
        local_208.size = 0;
        QVar35.m_data = (storage_type *)0x7;
        QVar35.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar35);
        local_268._0_8_ = local_108._0_8_;
        local_268._8_8_ = local_108._8_8_;
        local_268._16_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_268);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar36.m_data = (storage_type *)0xf;
        QVar36.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar36);
        local_88 = (undefined1  [8])local_108._0_8_;
        aStack_80.shared = (PrivateShared *)local_108._8_8_;
        aStack_80._8_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_88);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar37.m_data = (storage_type *)0xe;
        QVar37.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar37);
        local_228.d.d = (Data *)local_108._0_8_;
        local_228.d.ptr = (char16_t *)local_108._8_8_;
        local_228.d.size = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,&local_228);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar38.m_data = &DAT_00000006;
        QVar38.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar38);
        local_148._0_8_ = local_108._0_8_;
        local_148._8_8_ = local_108._8_8_;
        local_138 = (undefined1 *)local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_148);
        QList<QString>::end((QList<QString> *)&local_208);
        if ((QBrushData *)local_148._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        if ((QBrushData *)local_228.d.d != (QBrushData *)0x0) {
          LOCK();
          ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
          }
        }
        local_238 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_230 = &DAT_aaaaaaaaaaaaaaaa;
        local_248 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_240 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        local_268._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Parser::Parser((Parser *)local_268,local_188.ptr + 1,false);
        this = (QVariant *)(local_108 + 8);
        CVar9 = ~LogicalMode;
        bVar3 = false;
        iVar8 = -1;
        while( true ) {
          uVar21 = local_268._24_4_;
          lVar17 = (long)(int)local_268._24_4_;
          if ((long)local_268._16_8_ <= lVar17) break;
          iVar7 = local_268._24_4_;
          if (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == S) {
            pSVar13 = (Symbol *)(local_268._8_8_ + lVar17 * 0x28);
            lVar15 = -1;
            do {
              lVar18 = lVar15;
              pSVar13 = pSVar13 + 1;
              if (lVar17 - local_268._16_8_ == lVar18) break;
              lVar15 = lVar18 + -1;
            } while (pSVar13->token == S);
            local_268._24_4_ = local_268._24_4_ - (int)lVar18;
            iVar7 = uVar21 - (int)lVar18;
          }
          if (((long)local_268._16_8_ <= (long)iVar7) ||
             (((Symbol *)(local_268._8_8_ + (long)iVar7 * 0x28))->token != IDENT)) {
LAB_005db5c1:
            QBrush::QBrush((QBrush *)v);
            (v->variant).d.data._forAlignment = 8.39911597930119e-323;
            goto LAB_005db5d1;
          }
          local_268._24_4_ = iVar7 + 1;
          local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QCss::Symbol::lexem(&local_228,
                              (Symbol *)(local_268._8_8_ + ((long)(iVar7 + 1) + -1) * 0x28));
          uVar21 = local_268._24_4_;
          lVar17 = (long)(int)local_268._24_4_;
          iVar7 = local_268._24_4_;
          if (lVar17 < (long)local_268._16_8_) {
            if (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == S) {
              pSVar13 = (Symbol *)(local_268._8_8_ + lVar17 * 0x28);
              lVar15 = -1;
              do {
                lVar18 = lVar15;
                pSVar13 = pSVar13 + 1;
                if (lVar17 - local_268._16_8_ == lVar18) break;
                lVar15 = lVar18 + -1;
              } while (pSVar13->token == S);
              local_268._24_4_ = local_268._24_4_ - (int)lVar18;
              iVar7 = uVar21 - (int)lVar18;
            }
            lVar17 = (long)iVar7;
          }
          if ((lVar17 < (long)local_268._16_8_) &&
             (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == COLON)) {
            iVar12 = iVar7 + 1;
            lVar15 = (long)iVar12;
            lVar17 = local_268._16_8_ - lVar15;
            local_268._24_4_ = iVar12;
            if (lVar17 != 0 && lVar15 <= (long)local_268._16_8_) {
              pSVar13 = (Symbol *)(local_268._8_8_ + lVar15 * 0x28);
              iVar7 = iVar7 + 2;
              do {
                iVar12 = iVar7;
                if (pSVar13->token != S) break;
                pSVar13 = pSVar13 + 1;
                lVar17 = lVar17 + -1;
                iVar7 = iVar12 + 1;
                local_268._24_4_ = iVar12;
              } while (lVar17 != 0);
            }
            QVar39.m_data = (char *)0x4;
            QVar39.m_size = (qsizetype)&local_228;
            iVar7 = QString::compare(QVar39,0x6bf044);
            if (iVar7 == 0) {
              local_108._0_8_ =
                   (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)
                   0xaaaaaaaa00000000;
              local_108._24_8_ = 0;
              local_108._8_8_ = (Symbol *)0x0;
              local_108._16_8_ = (undefined1 *)0x0;
              local_e8.linear.x1 = 9.88131291682493e-324;
              local_88 = (undefined1  [8])0xaaaaaaaa00000000;
              aStack_80._16_8_ = 0;
              aStack_80.shared = (PrivateShared *)0x0;
              aStack_80._8_8_ = (undefined1 *)0x0;
              local_68 = 2;
              local_268._24_4_ = local_268._24_4_ + 1;
              bVar5 = QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_108);
              if (bVar5) {
                lVar17 = (long)(int)local_268._24_4_;
                iVar7 = local_268._24_4_;
                if ((lVar17 < (long)local_268._16_8_) &&
                   (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == S)) {
                  pSVar13 = (Symbol *)(local_268._8_8_ + lVar17 * 0x28);
                  lVar15 = -1;
                  do {
                    lVar18 = lVar15;
                    pSVar13 = pSVar13 + 1;
                    if (lVar17 - local_268._16_8_ == lVar18) break;
                    lVar15 = lVar18 + -1;
                  } while (pSVar13->token == S);
                  iVar7 = local_268._24_4_ - (int)lVar18;
                }
                local_268._24_4_ = iVar7 + 1;
                bVar5 = QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_88);
                if (!bVar5) goto LAB_005db29e;
                local_138 = &DAT_aaaaaaaaaaaaaaaa;
                local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_b0.type = local_88._0_4_;
                QVariant::QVariant(&local_b0.variant,(QVariant *)&aStack_80);
                parseColorValue((ColorData *)local_148,&local_b0);
                QVariant::~QVariant(&local_b0.variant);
                if (local_138._4_4_ == Role) {
                  bVar3 = true;
                }
                uVar22 = QVariant::toReal((bool *)this);
                if (local_138._4_4_ == Role) {
                  pQVar10 = QPalette::brush(in_RDX,Current,(ColorRole)local_138);
                  _Var1._M_head_impl =
                       (pQVar10->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>
                       ._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
                  local_168.first._0_4_ = ((_Var1._M_head_impl)->color).cspec;
                  uVar21 = *(undefined4 *)((long)&(_Var1._M_head_impl)->color + 4);
                  local_168.second.cspec = *(Spec *)((long)&(_Var1._M_head_impl)->color + 8);
                  local_168.second.ct.argb.alpha =
                       (ushort)*(undefined4 *)((long)&(_Var1._M_head_impl)->color + 0xc);
LAB_005db38b:
                  local_168.first._4_2_ = (ushort)uVar21;
                  local_168.first._6_2_ = (ushort)((uint)uVar21 >> 0x10);
                }
                else {
                  if (local_138._4_4_ == Color) {
                    local_168.first._0_4_ = local_148._0_4_;
                    uVar21 = local_148._4_4_;
                    local_168.second.cspec = local_148._8_4_;
                    local_168.second.ct.argb.alpha = local_148._12_2_;
                    goto LAB_005db38b;
                  }
                  local_168.first._0_4_ = Invalid;
                  local_168.first._4_2_ = 0xffff;
                  local_168.first._6_2_ = 0;
                  local_168.second.cspec = Invalid;
                  local_168.second.ct.argb.alpha = 0;
                }
                local_168.second.ct.argb.pad = local_168.second.ct.argb.alpha;
                local_168.second.ct._4_4_ = local_168.second.cspec;
                local_168.second.ct.argb.red = local_168.first._6_2_;
                local_168.second.ct.argb.alpha = local_168.first._4_2_;
                local_168.first._4_2_ = (ushort)((ulong)uVar22 >> 0x20);
                local_168.first._6_2_ = (ushort)((ulong)uVar22 >> 0x30);
                local_168.second.cspec = local_168.first._0_4_;
                local_168.first._0_4_ = (int)uVar22;
                QtPrivate::QMovableArrayOps<std::pair<double,QColor>>::
                emplace<std::pair<double,QColor>>
                          ((QMovableArrayOps<std::pair<double,QColor>> *)&local_1c8,local_1c8.d.size
                           ,&local_168);
                QList<std::pair<double,_QColor>_>::end
                          ((QList<std::pair<double,_QColor>_> *)&local_1c8);
                bVar5 = true;
              }
              else {
LAB_005db29e:
                QBrush::QBrush((QBrush *)v);
                (v->variant).d.data._forAlignment = 8.39911597930119e-323;
                bVar5 = false;
              }
              QVariant::~QVariant((QVariant *)&aStack_80);
              QVariant::~QVariant(this);
              if (!bVar5) goto LAB_005db0ee;
            }
            else {
              local_268._24_4_ = local_268._24_4_ + 1;
              local_108._0_8_ =
                   (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)
                   0xaaaaaaaa00000000;
              local_108._8_8_ = (Symbol *)0x0;
              local_108._16_8_ = (undefined1 *)0x0;
              local_108._24_8_ = 0;
              local_e8.linear.x1 = 9.88131291682493e-324;
              QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_108);
              QVar40.m_data = &DAT_00000006;
              QVar40.m_size = (qsizetype)&local_228;
              iVar7 = QString::compare(QVar40,0x6c462c);
              if (iVar7 == 0) {
                QVariant::toString();
                QVar43.m_data = (storage_type_conflict *)aStack_80.shared;
                QVar43.m_size = aStack_80._8_8_;
                iVar8 = QtPrivate::QStringList_indexOf
                                  ((QList_conflict *)&local_1e8,QVar43,0,CaseSensitive);
LAB_005db32c:
                if (local_88 != (undefined1  [8])0x0) {
                  LOCK();
                  *(int *)local_88 = *(int *)local_88 + -1;
                  UNLOCK();
                  if (*(int *)local_88 == 0) {
                    QArrayData::deallocate((QArrayData *)local_88,2,0x10);
                  }
                }
              }
              else {
                QVar41.m_data = (char *)0xe;
                QVar41.m_size = (qsizetype)&local_228;
                iVar7 = QString::compare(QVar41,0x6c4633);
                if (iVar7 == 0) {
                  QVariant::toString();
                  QVar44.m_data = (storage_type_conflict *)aStack_80.shared;
                  QVar44.m_size = aStack_80._8_8_;
                  CVar9 = QtPrivate::QStringList_indexOf
                                    ((QList_conflict *)&local_208,QVar44,0,CaseSensitive);
                  goto LAB_005db32c;
                }
                uVar22 = QVariant::toReal((bool *)this);
                QHash<QString,double>::tryEmplace_impl<QString_const&>
                          ((TryEmplaceResult *)local_88,(QHash<QString,double> *)&local_1f0,
                           &local_228);
                lVar17 = ((ulong)aStack_80.shared >> 7) * 0x90;
                *(undefined8 *)
                 (*(long *)(*(long *)((long)local_88 + 0x20) + 0x80 + lVar17) + 0x18 +
                 (ulong)*(byte *)((ulong)((uint)aStack_80.shared & 0x7f) +
                                 *(long *)((long)local_88 + 0x20) + lVar17) * 0x20) = uVar22;
              }
              QVariant::~QVariant(this);
            }
            uVar21 = local_268._24_4_;
            lVar17 = (long)(int)local_268._24_4_;
            iVar7 = local_268._24_4_;
            if (lVar17 < (long)local_268._16_8_) {
              if (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == S) {
                pSVar13 = (Symbol *)(local_268._8_8_ + lVar17 * 0x28);
                lVar15 = -1;
                do {
                  lVar18 = lVar15;
                  pSVar13 = pSVar13 + 1;
                  if (lVar17 - local_268._16_8_ == lVar18) break;
                  lVar15 = lVar18 + -1;
                } while (pSVar13->token == S);
                local_268._24_4_ = local_268._24_4_ - (int)lVar18;
                iVar7 = uVar21 - (int)lVar18;
              }
              lVar17 = (long)iVar7;
            }
            bVar5 = true;
            if ((lVar17 < (long)local_268._16_8_) &&
               (((Symbol *)(local_268._8_8_ + lVar17 * 0x28))->token == COMMA)) {
              local_268._24_4_ = iVar7 + 1;
            }
          }
          else {
            QBrush::QBrush((QBrush *)v);
            (v->variant).d.data._forAlignment = 8.39911597930119e-323;
LAB_005db0ee:
            bVar5 = false;
          }
          if ((QBrushData *)local_228.d.d != (QBrushData *)0x0) {
            LOCK();
            ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (!bVar5) goto LAB_005db5d1;
        }
        if (iVar6 == 2) {
          puVar16 = &DAT_006c4408;
          puVar19 = (undefined8 *)local_108;
          for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar19 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
            puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6c464b;
          if (local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"cy";
            uVar21 = 0;
            uVar23 = 0;
            uVar24 = 0;
            uVar25 = 0;
          }
          else {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88);
            uVar24 = 0;
            uVar25 = 0;
            uVar21 = 0;
            uVar23 = 0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              uVar21 = SUB84(pNVar11->value,0);
              uVar23 = (undefined4)((ulong)pNVar11->value >> 0x20);
            }
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"cy";
            if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
              pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228);
              if (pNVar11 == (Node<QString,_double> *)0x0) {
                uVar24 = 0;
                uVar25 = 0;
              }
              else {
                uVar24 = SUB84(pNVar11->value,0);
                uVar25 = (undefined4)((ulong)pNVar11->value >> 0x20);
              }
            }
          }
          local_148._0_8_ = &DAT_00000005;
          local_148._8_8_ = "angle";
          dVar26 = 0.0;
          if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148);
            dVar26 = 0.0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              dVar26 = pNVar11->value;
            }
          }
          QConicalGradient::QConicalGradient
                    ((QConicalGradient *)local_108,(qreal)CONCAT44(uVar23,uVar21),
                     (qreal)CONCAT44(uVar25,uVar24),dVar26);
          CVar14 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar14 = CVar9;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar14);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar8 != -1) {
            local_108._4_4_ = iVar8;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar3) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
        else if (iVar6 == 1) {
          puVar16 = &DAT_006c43b0;
          puVar19 = (undefined8 *)local_108;
          for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar19 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
            puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6c464b;
          if (local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"cy";
            uVar21 = 0;
            uVar23 = 0;
            local_298 = 0.0;
LAB_005db81c:
            local_2b0 = (qreal)CONCAT44(uVar23,uVar21);
          }
          else {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88);
            uVar21 = 0;
            uVar23 = 0;
            local_2b0 = 0.0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              uVar21 = SUB84(pNVar11->value,0);
              uVar23 = (undefined4)((ulong)pNVar11->value >> 0x20);
            }
            local_298 = (qreal)CONCAT44(uVar23,uVar21);
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"cy";
            if ((local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) &&
               (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                          findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228),
               pNVar11 != (Node<QString,_double> *)0x0)) {
              uVar21 = SUB84(pNVar11->value,0);
              uVar23 = (undefined4)((ulong)pNVar11->value >> 0x20);
              goto LAB_005db81c;
            }
          }
          local_148._0_8_ = &DAT_00000006;
          local_148._8_8_ = "radius";
          if (local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            local_168.first._0_4_ = 2;
            local_168.first._4_2_ = 0;
            local_168.first._6_2_ = 0;
            local_168.second.cspec = 0x6c4655;
            local_168.second.ct.argb.alpha = 0;
            local_168.second.ct.argb.red = 0;
            dVar26 = 0.0;
            dVar27 = 0.0;
          }
          else {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148);
            dVar27 = 0.0;
            dVar26 = 0.0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              dVar26 = pNVar11->value;
            }
            local_168.first._0_4_ = 2;
            local_168.first._4_2_ = 0;
            local_168.first._6_2_ = 0;
            local_168.second.cspec = 0x6c4655;
            local_168.second.ct.argb.alpha = 0;
            local_168.second.ct.argb.red = 0;
            if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
              pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_168);
              if (pNVar11 == (Node<QString,_double> *)0x0) {
                dVar27 = 0.0;
              }
              else {
                dVar27 = pNVar11->value;
              }
            }
          }
          local_278.m_size = 2;
          local_278.m_data = "fy";
          fy = 0.0;
          if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,&local_278);
            fy = 0.0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              fy = pNVar11->value;
            }
          }
          QRadialGradient::QRadialGradient
                    ((QRadialGradient *)local_108,local_298,local_2b0,dVar26,dVar27,fy);
          CVar14 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar14 = CVar9;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar14);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar8 != -1) {
            local_108._4_4_ = iVar8;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar3) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
        else {
          if (iVar6 != 0) goto LAB_005db5c1;
          puVar16 = &DAT_006c4358;
          puVar19 = (undefined8 *)local_108;
          for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar19 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
            puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6c4642;
          if (local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"y1";
            uVar21 = 0;
            uVar23 = 0;
            uVar24 = 0;
            uVar25 = 0;
          }
          else {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88);
            uVar24 = 0;
            uVar25 = 0;
            uVar21 = 0;
            uVar23 = 0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              uVar21 = SUB84(pNVar11->value,0);
              uVar23 = (undefined4)((ulong)pNVar11->value >> 0x20);
            }
            local_228.d.d = (Data *)0x2;
            local_228.d.ptr = L"y1";
            if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
              pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228);
              if (pNVar11 == (Node<QString,_double> *)0x0) {
                uVar24 = 0;
                uVar25 = 0;
              }
              else {
                uVar24 = SUB84(pNVar11->value,0);
                uVar25 = (undefined4)((ulong)pNVar11->value >> 0x20);
              }
            }
          }
          local_148._0_8_ = (QBrushData *)0x2;
          local_148._8_8_ = "x2";
          if (local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
            local_168.first._0_4_ = 2;
            local_168.first._4_2_ = 0;
            local_168.first._6_2_ = 0;
            local_168.second.cspec = 0x6c4648;
            local_168.second.ct.argb.alpha = 0;
            local_168.second.ct.argb.red = 0;
            dVar26 = 0.0;
            dVar27 = 0.0;
          }
          else {
            pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                      findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148);
            dVar27 = 0.0;
            dVar26 = 0.0;
            if (pNVar11 != (Node<QString,_double> *)0x0) {
              dVar26 = pNVar11->value;
            }
            local_168.first._0_4_ = 2;
            local_168.first._4_2_ = 0;
            local_168.first._6_2_ = 0;
            local_168.second.cspec = 0x6c4648;
            local_168.second.ct.argb.alpha = 0;
            local_168.second.ct.argb.red = 0;
            if (local_1f0.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0) {
              pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_168);
              if (pNVar11 == (Node<QString,_double> *)0x0) {
                dVar27 = 0.0;
              }
              else {
                dVar27 = pNVar11->value;
              }
            }
          }
          QLinearGradient::QLinearGradient
                    ((QLinearGradient *)local_108,(qreal)CONCAT44(uVar23,uVar21),
                     (qreal)CONCAT44(uVar25,uVar24),dVar26,dVar27);
          CVar14 = ObjectBoundingMode;
          if (-1 < (int)CVar9) {
            CVar14 = CVar9;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar14);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar8 != -1) {
            local_108._4_4_ = iVar8;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar3) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
LAB_005db5d1:
        if (pQStack_240 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_240,2,0x10);
          }
        }
        QArrayDataPointer<QCss::Symbol>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Symbol> *)local_268);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1e8);
        if ((QBrushData *)local_1c8.d.d != (QBrushData *)0x0) {
          LOCK();
          ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,0x18,0x10);
          }
        }
        QHash<QString,_double>::~QHash(&local_1f0);
        goto LAB_005db64e;
      }
      QBrush::QBrush((QBrush *)v);
      (v->variant).d.data._forAlignment = 8.39911597930119e-323;
LAB_005db64e:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
    }
    else {
      QBrush::QBrush((QBrush *)v);
      (v->variant).d.data._forAlignment = 8.39911597930119e-323;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
    uVar22 = extraout_RDX_02;
  }
  else {
    QBrush::QBrush((QBrush *)v);
    (v->variant).d.data._forAlignment = 8.39911597930119e-323;
    uVar22 = extraout_RDX_01;
  }
  DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = ((DataPtr *)(in_FS_OFFSET + 0x28))->_M_t
  ;
  if ((tuple<QBrushData_*,_QBrushDataPointerDeleter>)
      DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>)
      local_38._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl) {
    __stack_chk_fail();
  }
  BVar45.role = (int)uVar22;
  BVar45.type = (int)((ulong)uVar22 >> 0x20);
  BVar45.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       (DataPtr)(DataPtr)DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                         .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  return BVar45;
}

Assistant:

static BrushData parseBrushValue(const QCss::Value &v, const QPalette &pal)
{
    ColorData c = parseColorValue(v);
    if (c.type == ColorData::Color) {
        return QBrush(c.color);
    } else if (c.type == ColorData::Role) {
        return c.role;
    }

    if (v.type != Value::Function)
        return BrushData();

    QStringList lst = v.variant.toStringList();
    if (lst.size() != 2)
        return BrushData();

    QStringList gradFuncs;
    gradFuncs << "qlineargradient"_L1 << "qradialgradient"_L1 << "qconicalgradient"_L1 << "qgradient"_L1;
    int gradType = -1;

    if ((gradType = gradFuncs.indexOf(lst.at(0).toLower())) == -1)
        return BrushData();

    QHash<QString, qreal> vars;
    QList<QGradientStop> stops;

    int spread = -1;
    QStringList spreads;
    spreads << "pad"_L1 << "reflect"_L1 << "repeat"_L1;

    int coordinateMode = -1;
    QStringList coordinateModes;
    coordinateModes << "logical"_L1 << "stretchtodevice"_L1 << "objectbounding"_L1 << "object"_L1;

    bool dependsOnThePalette = false;
    Parser parser(lst.at(1));
    while (parser.hasNext()) {
        parser.skipSpace();
        if (!parser.test(IDENT))
            return BrushData();
        QString attr = parser.lexem();
        parser.skipSpace();
        if (!parser.test(COLON))
            return BrushData();
        parser.skipSpace();
        if (attr.compare("stop"_L1, Qt::CaseInsensitive) == 0) {
            QCss::Value stop, color;
            parser.next();
            if (!parser.parseTerm(&stop)) return BrushData();
            parser.skipSpace();
            parser.next();
            if (!parser.parseTerm(&color)) return BrushData();
            ColorData cd = parseColorValue(color);
            if (cd.type == ColorData::Role)
                dependsOnThePalette = true;
            stops.append(QGradientStop(stop.variant.toReal(), colorFromData(cd, pal)));
        } else {
            parser.next();
            QCss::Value value;
            (void)parser.parseTerm(&value);
            if (attr.compare("spread"_L1, Qt::CaseInsensitive) == 0)
                spread = spreads.indexOf(value.variant.toString());
            else if (attr.compare("coordinatemode"_L1, Qt::CaseInsensitive) == 0)
                coordinateMode = coordinateModes.indexOf(value.variant.toString());
            else
                vars[attr] = value.variant.toReal();
        }
        parser.skipSpace();
        (void)parser.test(COMMA);
    }

    if (gradType == 0) {
        QLinearGradient lg(vars.value("x1"_L1), vars.value("y1"_L1),
                           vars.value("x2"_L1), vars.value("y2"_L1));
        lg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        lg.setStops(stops);
        if (spread != -1)
            lg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(lg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 1) {
        QRadialGradient rg(vars.value("cx"_L1), vars.value("cy"_L1),
                           vars.value("radius"_L1), vars.value("fx"_L1),
                           vars.value("fy"_L1));
        rg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        rg.setStops(stops);
        if (spread != -1)
            rg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(rg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 2) {
        QConicalGradient cg(vars.value("cx"_L1), vars.value("cy"_L1), vars.value("angle"_L1));
        cg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        cg.setStops(stops);
        if (spread != -1)
            cg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(cg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    return BrushData();
}